

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

void * rw::skinOpen(void *o,int32 param_2,int32 param_3)

{
  uint local_1c;
  uint i;
  int32 param_2_local;
  int32 param_1_local;
  void *o_local;
  
  _DAT_00168c50 = ObjPipeline::create();
  (_DAT_00168c50->super_Pipeline).pluginID = 0x116;
  (_DAT_00168c50->super_Pipeline).pluginData = 1;
  for (local_1c = 0; local_1c < 0xd; local_1c = local_1c + 1) {
    *(ObjPipeline **)(&DAT_00168be8 + (ulong)local_1c * 8) = _DAT_00168c50;
  }
  return o;
}

Assistant:

static void*
skinOpen(void *o, int32, int32)
{
	// init dummy pipelines
	skinGlobals.dummypipe = ObjPipeline::create();
	skinGlobals.dummypipe->pluginID = ID_SKIN;
	skinGlobals.dummypipe->pluginData = 1;
	for(uint i = 0; i < nelem(skinGlobals.pipelines); i++)
		skinGlobals.pipelines[i] = skinGlobals.dummypipe;
	return o;
}